

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_disk_io.cpp
# Opt level: O3

void __thiscall libtorrent::mmap_disk_io::execute_job(mmap_disk_io *this,mmap_disk_job *j)

{
  jobqueue_t *jobs;
  int iVar1;
  jobqueue_t local_68;
  jobqueue_t local_48;
  jobqueue_t local_28;
  
  local_68.m_first = (disk_job *)0x0;
  local_68.m_last = (disk_job *)0x0;
  local_68.m_size = 0;
  if (((j->super_disk_job).flags.m_val & 0x40) == 0) {
    perform_job(this,j,&local_68);
    if (local_68.m_size == 0) {
      return;
    }
    jobs = &local_48;
    local_48.m_first = local_68.m_first;
    local_48.m_last = local_68.m_last;
    iVar1 = local_68.m_size;
  }
  else {
    (j->super_disk_job).ret.m_val = '\x01';
    (j->super_disk_job).error.ec.val_ = 0x7d;
    (j->super_disk_job).error.ec.failed_ = true;
    *(undefined3 *)&(j->super_disk_job).error.ec.field_0x5 = 0;
    (j->super_disk_job).error.ec.cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    *(undefined4 *)&(j->super_disk_job).error.field_0x10 = 0xffffff;
    (j->super_disk_job).super_tailqueue_node<libtorrent::aux::disk_job>.next = (disk_job *)0x0;
    jobs = &local_28;
    iVar1 = 1;
    local_28.m_first = &j->super_disk_job;
    local_28.m_last = &j->super_disk_job;
  }
  jobs->m_size = iVar1;
  add_completed_jobs(this,jobs);
  return;
}

Assistant:

void mmap_disk_io::execute_job(aux::mmap_disk_job* j)
	{
		jobqueue_t completed_jobs;
		if (j->flags & aux::disk_job::aborted)
		{
			j->ret = disk_status::fatal_disk_error;
			j->error = storage_error(boost::asio::error::operation_aborted);
			completed_jobs.push_back(j);
			add_completed_jobs(std::move(completed_jobs));
			return;
		}

		perform_job(j, completed_jobs);
		if (!completed_jobs.empty())
			add_completed_jobs(std::move(completed_jobs));
	}